

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O2

void __thiscall Fl_XPM_Image::Fl_XPM_Image(Fl_XPM_Image *this,char *name)

{
  char **ppcVar1;
  int iVar2;
  FILE *__stream;
  char **__dest;
  char *pcVar3;
  char *__dest_00;
  byte bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte *__s;
  byte *pbVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  bool bVar14;
  int local_888;
  int ncolors;
  Fl_Pixmap *local_880;
  int local_878;
  int chars_per_pixel;
  int H;
  int W;
  char **local_868;
  byte *local_860;
  ulong local_858;
  ulong local_850;
  char buffer [2068];
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_00258710;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    local_880 = &this->super_Fl_Pixmap;
    __dest = (char **)operator_new__(0x800);
    local_858 = ~(ulong)buffer;
    local_878 = (int)buffer + 0x813;
    local_888 = 0x100;
    uVar13 = 0;
LAB_001b2dc7:
    __s = (byte *)(buffer + 1);
    pcVar3 = fgets(buffer,0x814,__stream);
    if (pcVar3 != (char *)0x0) {
      if (buffer[0] == '\"') {
        lVar7 = 0;
        local_868 = __dest;
        local_850 = uVar13;
        do {
          iVar10 = local_878 - (int)__s;
          lVar11 = 0;
          pbVar12 = __s;
          local_860 = __s;
          while( true ) {
            uVar13 = local_850;
            __s = pbVar12 + 1;
            bVar4 = *pbVar12;
            if ((bVar4 == 0x22) || (0x7ff < lVar7)) {
              buffer[lVar7] = '\0';
              lVar11 = (long)local_888;
              __dest = local_868;
              if (lVar11 <= (long)local_850) {
                uVar8 = lVar11 * 8 + 0x800;
                if (local_888 < -0x100) {
                  uVar8 = 0xffffffffffffffff;
                }
                __dest = (char **)operator_new__(uVar8);
                ppcVar1 = local_868;
                local_888 = local_888 + 0x100;
                memcpy(__dest,local_868,lVar11 << 3);
                if (ppcVar1 != (char **)0x0) {
                  operator_delete__(ppcVar1);
                }
              }
              if ((uVar13 == 0) &&
                 (iVar10 = __isoc99_sscanf(buffer,"%d%d%d%d",&W,&H,&ncolors,&chars_per_pixel),
                 iVar10 < 4)) {
                uVar13 = 0;
                goto LAB_001b3053;
              }
              iVar10 = ncolors;
              if (ncolors < 0) {
                iVar10 = 1;
              }
              if (((long)iVar10 < (long)uVar13) &&
                 ((long)(buffer + local_858 + lVar7 + 1) < (long)W * (long)chars_per_pixel))
              goto LAB_001b3053;
              pcVar3 = buffer + (lVar7 - (long)buffer) + 1;
              iVar10 = ncolors * -4;
              if (-1 < ncolors) {
                iVar10 = chars_per_pixel;
              }
              if ((long)pcVar3 <= (long)iVar10) goto LAB_001b3053;
              __dest_00 = (char *)operator_new__((ulong)(pcVar3 + 1));
              __dest[uVar13] = __dest_00;
              memcpy(__dest_00,buffer,(size_t)pcVar3);
              __dest[uVar13][(long)pcVar3] = '\0';
              uVar13 = uVar13 + 1;
              this = (Fl_XPM_Image *)local_880;
              goto LAB_001b2dc7;
            }
            if (bVar4 != 0x5c) break;
            bVar4 = *__s;
            if (bVar4 != 0) {
              if ((bVar4 == 10) || (bVar4 == 0xd)) {
                fgets((char *)__s,(int)lVar11 + iVar10,__stream);
                goto LAB_001b2e4b;
              }
              if (bVar4 == 0x78) {
                pbVar12 = local_860 + (2 - lVar11);
                pbVar9 = local_860 + (4 - lVar11);
                iVar5 = 0;
                iVar10 = 2;
                while ((bVar14 = iVar10 != 0, iVar10 = iVar10 + -1, __s = pbVar9, bVar14 &&
                       (iVar2 = hexdigit((int)(char)*pbVar12), __s = pbVar12, iVar2 < 0x10))) {
                  pbVar12 = pbVar12 + 1;
                  iVar5 = iVar5 * 0x10 + iVar2;
                }
                buffer[lVar7] = (char)iVar5;
              }
              else {
                pbVar12 = local_860 + (2 - lVar11);
                __s = pbVar12;
                if ((bVar4 & 0xf8) == 0x30) {
                  uVar6 = (uint)(byte)(bVar4 - 0x30);
                  pbVar9 = local_860 + (4 - lVar11);
                  iVar10 = 2;
                  while( true ) {
                    bVar4 = (byte)uVar6;
                    bVar14 = iVar10 == 0;
                    iVar10 = iVar10 + -1;
                    __s = pbVar9;
                    if ((bVar14) ||
                       (iVar5 = hexdigit((int)(char)*pbVar12), __s = pbVar12, 7 < iVar5)) break;
                    pbVar12 = pbVar12 + 1;
                    uVar6 = iVar5 + uVar6 * 8;
                  }
                }
                buffer[lVar7] = bVar4;
              }
              goto LAB_001b2ee5;
            }
LAB_001b2e4b:
            lVar11 = lVar11 + -1;
            pbVar12 = __s;
          }
          buffer[lVar7] = bVar4;
LAB_001b2ee5:
          lVar7 = lVar7 + 1;
        } while( true );
      }
      goto LAB_001b2dc7;
    }
    fclose(__stream);
    if (uVar13 == 0) {
      uVar13 = 0;
      __stream = (FILE *)0x0;
    }
    else {
      iVar10 = 2;
      if (-1 < ncolors) {
        iVar10 = ncolors + 1;
      }
      if (iVar10 + H <= (int)uVar13) {
        (this->super_Fl_Pixmap).super_Fl_Image.data_ = __dest;
        (this->super_Fl_Pixmap).super_Fl_Image.count_ = (int)uVar13;
        (this->super_Fl_Pixmap).alloc_data = 1;
        Fl_Pixmap::measure(&this->super_Fl_Pixmap);
        return;
      }
      __stream = (FILE *)0x0;
    }
LAB_001b3053:
    for (uVar13 = uVar13 & 0xffffffff; 0 < (long)uVar13; uVar13 = uVar13 - 1) {
      if (__dest[uVar13 - 1] != (char *)0x0) {
        operator_delete__(__dest[uVar13 - 1]);
      }
    }
    if (__dest != (char **)0x0) {
      operator_delete__(__dest);
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

Fl_XPM_Image::Fl_XPM_Image(const char *name) : Fl_Pixmap((char *const*)0) {
  FILE *f;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  // read all the c-strings out of the file:
  char** new_data = new char *[INITIALLINES];
  char** temp_data;
  int malloc_size = INITIALLINES;
  char buffer[MAXSIZE+20];
  int i = 0;
  int W,H,ncolors,chars_per_pixel;
  while (fgets(buffer,MAXSIZE+20,f)) {
    if (buffer[0] != '\"') continue;
    char *myp = buffer;
    char *q = buffer+1;
    while (*q != '\"' && myp < buffer+MAXSIZE) {
      if (*q == '\\') switch (*++q) {
      case '\r':
      case '\n':
	if (!fgets(q,(int) (buffer+MAXSIZE+20-q),f)) { /* no problem if we hit EOF */ } break;
      case 0:
	break;
      case 'x': {
	q++;
	int n = 0;
	for (int x = 0; x < 2; x++) {
	  int xd = hexdigit(*q);
	  if (xd > 15) break;
	  n = (n<<4)+xd;
	  q++;
	}
	*myp++ = n;
      } break;
      default: {
	int c = *q++;
	if (c>='0' && c<='7') {
	  c -= '0';
	  for (int x=0; x<2; x++) {
	    int xd = hexdigit(*q);
	    if (xd>7) break;
	    c = (c<<3)+xd;
	    q++;
	  }
	}
	*myp++ = c;
      } break;
      } else {
	*myp++ = *q++;
      }
    }
    *myp++ = 0;
    if (i >= malloc_size) {
      temp_data = new char *[malloc_size + INITIALLINES];
      memcpy(temp_data, new_data, sizeof(char *) * malloc_size);
      delete[] new_data;
      new_data = temp_data;
      malloc_size += INITIALLINES;
    }
    // first line has 4 ints: width, height, ncolors, chars_per_pixel
    // followed by color segment: 
    //   if ncolors < 0 this is FLTK (non standard) compressed colormap - all colors coded in single line of 4*ncolors bytes
    //   otherwise - ncolor lines of at least chars_per_pixel bytes
    // followed by pic segment: H lines of at least chars_per_pixel*W bytes
    // next line: would have loved to use measure_pixmap, but it doesn't return all the data!
    if ((!i) && (sscanf(buffer,"%d%d%d%d", &W, &H, &ncolors, &chars_per_pixel) < 4)) goto bad_data; // first line
    else if ((i > (ncolors<0?1:ncolors)) && (myp-buffer-1<W*chars_per_pixel)) goto bad_data; // pic segment
    else if (myp-buffer-1<(ncolors<0?-ncolors*4:chars_per_pixel)) goto bad_data; // color segment
    new_data[i] = new char[myp-buffer+1];
    memcpy(new_data[i], buffer,myp-buffer);
    new_data[i][myp-buffer] = 0;
    i++;
  }

  fclose(f);
  f = NULL;
  if ((!i) || (i<1+(ncolors<0?1:ncolors)+H)) goto bad_data;
  data((const char **)new_data, i);
  alloc_data = 1;

  measure();
  return;
  // dealloc and close as needed when bad data was found
bad_data:
  while (i > 0) delete[] new_data[--i];
  delete[] new_data;
  if (f) fclose(f);
}